

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

Ignored __thiscall
duckdb_re2::CaptureNamesWalker::PreVisit
          (CaptureNamesWalker *this,Regexp *re,Ignored ignored,bool *stop)

{
  _Rb_tree_header *p_Var1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar2;
  mapped_type *pmVar3;
  key_type_conflict4 local_24;
  
  if ((re->op_ == '\v') && ((re->arguments).capture.name_ != (string *)0x0)) {
    if (this->map_ ==
        (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x0) {
      pmVar2 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)operator_new(0x30);
      p_Var1 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
      (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      this->map_ = pmVar2;
    }
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this->map_,&local_24);
    std::__cxx11::string::_M_assign((string *)pmVar3);
  }
  return ignored;
}

Assistant:

virtual Ignored PreVisit(Regexp* re, Ignored ignored, bool* stop) {
    if (re->op() == kRegexpCapture && re->name() != NULL) {
      // Allocate map once we find a name.
      if (map_ == NULL)
        map_ = new std::map<int, std::string>;

      (*map_)[re->cap()] = *re->name();
    }
    return ignored;
  }